

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

Metric * __thiscall hta::Directory::operator[](Directory *this,string *name)

{
  bool bVar1;
  __type_conflict _Var2;
  reference __lhs;
  pointer ppVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_false,_true>,_bool>
  pVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_true>
  local_110;
  undefined1 local_108;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_true>
  local_100;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_false,_true>,_bool>
  it_1;
  Metric metric;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *prefix;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *elem;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
  *__range1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_true>
  local_48 [3];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_true>
  local_30;
  iterator it;
  lock_guard<hta::OptionalMutex> guard;
  string *name_local;
  Directory *this_local;
  
  std::lock_guard<hta::OptionalMutex>::lock_guard
            ((lock_guard<hta::OptionalMutex> *)&it,&this->mutex_);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>_>_>
       ::find(&this->metrics_,name);
  local_48[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>_>_>
       ::end(&this->metrics_);
  bVar1 = std::__detail::operator!=(&local_30,local_48);
  if (bVar1) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_false,_true>
                           *)&local_30);
  }
  else {
    __end1 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
             ::begin(&this->prefixes_);
    elem = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
              ::end(&this->prefixes_);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>_>
                                  *)&elem);
      if (!bVar1) {
        std::__cxx11::string::string((string *)&local_130,(string *)name);
        throw_exception<hta::MissingMetricConfig,char_const*,std::__cxx11::string>
                  ("no settings found to create metric ",&local_130);
      }
      __lhs = __gnu_cxx::
              __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>_>
              ::operator*(&__end1);
      std::__cxx11::string::size();
      std::__cxx11::string::substr
                ((ulong)&metric.levels_._M_t._M_impl.super__Rb_tree_header._M_node_count,(ulong)name
                );
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&metric.levels_._M_t._M_impl.super__Rb_tree_header.
                                        _M_node_count);
      std::__cxx11::string::~string
                ((string *)&metric.levels_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (_Var2) break;
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>_>
      ::operator++(&__end1);
    }
    make_metric((Metric *)&it_1.second,this,name,&__lhs->second);
    pVar4 = std::
            unordered_map<std::__cxx11::string,hta::Metric,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,hta::Metric>>>
            ::emplace<std::__cxx11::string_const&,hta::Metric>
                      ((unordered_map<std::__cxx11::string,hta::Metric,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,hta::Metric>>>
                        *)&this->metrics_,name,(Metric *)&it_1.second);
    local_110._M_cur =
         (__node_type *)
         pVar4.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_true>
         ._M_cur;
    local_108 = pVar4.second;
    local_100._M_cur = local_110._M_cur;
    it_1.first.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_true>
    ._M_cur._0_1_ = local_108;
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("it.second",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/directory.cpp"
                    ,0xa5,"Metric &hta::Directory::operator[](const std::string &)");
    }
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_false,_true>
                           *)&local_100);
    Metric::~Metric((Metric *)&it_1.second);
  }
  this_local = (Directory *)&ppVar3->second;
  std::lock_guard<hta::OptionalMutex>::~lock_guard((lock_guard<hta::OptionalMutex> *)&it);
  return (Metric *)this_local;
}

Assistant:

Metric& Directory::operator[](const std::string& name)
{
    std::lock_guard<OptionalMutex> guard(mutex_);
    if (auto it = metrics_.find(name); it != metrics_.end())
    {
        return it->second;
    }
    for (const auto& elem : prefixes_)
    {
        const auto& prefix = elem.first;
        if (prefix == name.substr(0, prefix.size()))
        {
            Metric metric = make_metric(name, elem.second);
            {
                auto it = metrics_.emplace(name, std::move(metric));
                assert(it.second);
                return it.first->second;
            }
        }
    }
    throw_exception<MissingMetricConfig>("no settings found to create metric ", name);
}